

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

size_t testing::internal::GetThreadCount(void)

{
  __pid_t _Var1;
  int iVar2;
  string filename;
  string dummy;
  ifstream file;
  string local_268;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_228 [65];
  
  Message::Message((Message *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_228[0]._M_head_impl + 0x10),"/proc/",6);
  _Var1 = getpid();
  std::ostream::operator<<((ostream *)(local_228[0]._M_head_impl + 0x10),_Var1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_228[0]._M_head_impl + 0x10),"/stat",5);
  StringStreamToString(&local_268,local_228[0]._M_head_impl);
  if (local_228[0]._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_228[0]._M_head_impl + 8))();
  }
  local_240 = 0;
  local_238 = 0;
  local_248 = &local_238;
  std::ifstream::ifstream(local_228,local_268._M_dataplus._M_p,_S_in);
  iVar2 = -0x14;
  while (iVar2 = iVar2 + 1, iVar2 != 0) {
    std::operator>>((istream *)local_228,(string *)&local_248);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)local_228);
  std::ifstream::~ifstream(local_228);
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}